

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::Registry::Add(Registry *this,BorderAgent *aValue)

{
  Status SVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  Status *pSVar6;
  reference pvVar7;
  undefined1 *puVar8;
  reference pvVar9;
  undefined1 local_438 [6];
  Status thrownStatus;
  Status thrownStatus_1;
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  routers;
  BorderRouter lookupBr;
  undefined1 local_290 [8];
  BorderRouter br;
  undefined1 local_100 [4];
  NetworkId networkId;
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  nwks;
  undefined1 local_e0 [7];
  bool networkCreated;
  Network nwk;
  DomainId domainId;
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  domains;
  Status local_4a;
  undefined1 local_48 [6];
  Status status;
  bool domainCreated;
  Domain dom;
  BorderAgent *aValue_local;
  Registry *this_local;
  
  dom.mName.field_2._8_8_ = aValue;
  Domain::Domain((Domain *)local_48);
  if ((*(uint *)(dom.mName.field_2._8_8_ + 0x170) & 0x1000) != 0) {
    std::__cxx11::string::operator=((string *)&dom,(string *)(dom.mName.field_2._8_8_ + 0x120));
    std::
    vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
    ::vector((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              *)&domainId);
    iVar3 = (*this->mStorage->_vptr_PersistentStorage[0x15])
                      (this->mStorage,local_48,
                       (vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                        *)&domainId);
    SVar1 = anon_unknown_0::MapStatus((Status)iVar3);
    if ((SVar1 == kError) ||
       (sVar4 = std::
                vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                ::size((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                        *)&domainId), 1 < sVar4)) {
      this_local._7_1_ = kError;
      nwk._92_4_ = 1;
    }
    else {
      if (SVar1 == kNotFound) {
        DomainId::DomainId((DomainId *)&nwk.mCcm,0xffffffff);
        iVar3 = (*this->mStorage->_vptr_PersistentStorage[5])(this->mStorage,local_48,&nwk.mCcm);
        SVar1 = anon_unknown_0::MapStatus((Status)iVar3);
        if (SVar1 != kSuccess) {
          nwk._92_4_ = 1;
          this_local._7_1_ = SVar1;
          goto LAB_0022a770;
        }
        local_48._0_4_ = nwk.mCcm;
      }
      else {
        pvVar5 = std::
                 vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                 ::operator[]((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                               *)&domainId,0);
        Domain::operator=((Domain *)local_48,pvVar5);
      }
      nwk._92_4_ = 0;
    }
LAB_0022a770:
    std::
    vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
    ::~vector((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
               *)&domainId);
    if (nwk._92_4_ != 0) goto LAB_0022ae78;
  }
  Network::Network((Network *)local_e0);
  if (((*(uint *)(dom.mName.field_2._8_8_ + 0x170) & 0x10) != 0) ||
     ((*(uint *)(dom.mName.field_2._8_8_ + 0x170) & 0x20) != 0)) {
    if ((*(uint *)(dom.mName.field_2._8_8_ + 0x170) & 0x20) == 0) {
      std::__cxx11::string::operator=((string *)&nwk,(string *)(dom.mName.field_2._8_8_ + 0x70));
    }
    else {
      nwk.mName.field_2._8_8_ = *(undefined8 *)(dom.mName.field_2._8_8_ + 0x90);
    }
    std::
    vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
    ::vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              *)local_100);
    iVar3 = (*this->mStorage->_vptr_PersistentStorage[0x16])
                      (this->mStorage,local_e0,
                       (vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                        *)local_100);
    SVar1 = anon_unknown_0::MapStatus((Status)iVar3);
    if ((SVar1 == kError) ||
       (sVar4 = std::
                vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ::size((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                        *)local_100), 1 < sVar4)) {
      pSVar6 = (Status *)__cxa_allocate_exception(1);
      *pSVar6 = SVar1;
      __cxa_throw(pSVar6,&Status::typeinfo,0);
    }
    if (SVar1 == kNotFound) {
      NetworkId::NetworkId((NetworkId *)&br.mAgent.field_0x174,0xffffffff);
      if (((*(uint *)(dom.mName.field_2._8_8_ + 0x170) & 0x20) != 0) &&
         ((*(uint *)(dom.mName.field_2._8_8_ + 0x170) & 0x10) != 0)) {
        std::__cxx11::string::operator=((string *)&nwk,(string *)(dom.mName.field_2._8_8_ + 0x70));
      }
      stack0xffffffffffffff24 = local_48._0_4_;
      nwk.mName.field_2._8_8_ = *(undefined8 *)(dom.mName.field_2._8_8_ + 0x90);
      nwk.mMlp.field_2._8_4_ = ZEXT14((*(ushort *)(dom.mName.field_2._8_8_ + 0x68) & 7) == 4);
      iVar3 = (*this->mStorage->_vptr_PersistentStorage[6])
                        (this->mStorage,local_e0,&br.mAgent.field_0x174);
      SVar1 = anon_unknown_0::MapStatus((Status)iVar3);
      if (SVar1 != kSuccess) {
        pSVar6 = (Status *)__cxa_allocate_exception(1);
        *pSVar6 = SVar1;
        __cxa_throw(pSVar6,&Status::typeinfo,0);
      }
      local_e0._0_4_ = br.mAgent._372_4_;
    }
    else {
      pvVar7 = std::
               vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ::operator[]((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                             *)local_100,0);
      Network::operator=((Network *)local_e0,pvVar7);
      if ((stack0xffffffffffffff24 != local_48._0_4_) ||
         (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&nwk,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)(dom.mName.field_2._8_8_ + 0x70)), bVar2)) {
        stack0xffffffffffffff24 = local_48._0_4_;
        std::__cxx11::string::operator=((string *)&nwk,(string *)(dom.mName.field_2._8_8_ + 0x70));
        iVar3 = (*this->mStorage->_vptr_PersistentStorage[0x12])(this->mStorage,local_e0);
        SVar1 = anon_unknown_0::MapStatus((Status)iVar3);
        if (SVar1 != kSuccess) {
          pSVar6 = (Status *)__cxa_allocate_exception(1);
          *pSVar6 = SVar1;
          __cxa_throw(pSVar6,&Status::typeinfo,0);
        }
      }
    }
    std::
    vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
    ::~vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               *)local_100);
  }
  BorderRouterId::BorderRouterId((BorderRouterId *)&lookupBr.mAgent.field_0x174,0xffffffff);
  BorderRouter::BorderRouter
            ((BorderRouter *)local_290,(BorderRouterId *)&lookupBr.mAgent.field_0x174,
             (NetworkId *)local_e0,(BorderAgent *)dom.mName.field_2._8_8_);
  if (br._vptr_BorderRouter._4_4_ == -1) {
    puVar8 = (undefined1 *)__cxa_allocate_exception(1);
    *puVar8 = 4;
    __cxa_throw(puVar8,&Status::typeinfo,0);
  }
  BorderRouter::BorderRouter
            ((BorderRouter *)
             &routers.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::operator=
            ((string *)&lookupBr.mAgent,(string *)(dom.mName.field_2._8_8_ + 8));
  lookupBr.mAgent.mNetworkName.field_2._8_8_ = *(undefined8 *)(dom.mName.field_2._8_8_ + 0x90);
  lookupBr.mAgent.mUpdateTimestamp.mTime._0_4_ = 0x21;
  std::
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ::vector((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            *)local_438);
  iVar3 = (*this->mStorage->_vptr_PersistentStorage[0x17])
                    (this->mStorage,
                     &routers.
                      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                      *)local_438);
  local_4a = anon_unknown_0::MapStatus((Status)iVar3);
  if ((local_4a == kSuccess) &&
     (sVar4 = std::
              vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ::size((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                      *)local_438), sVar4 == 1)) {
    pvVar9 = std::
             vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
             ::operator[]((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                           *)local_438,0);
    br._vptr_BorderRouter._0_4_ = (pvVar9->mId).mId;
    iVar3 = (*this->mStorage->_vptr_PersistentStorage[0x13])(this->mStorage,local_290);
    local_4a = anon_unknown_0::MapStatus((Status)iVar3);
  }
  else if (local_4a == kNotFound) {
    iVar3 = (*this->mStorage->_vptr_PersistentStorage[7])(this->mStorage,local_290,&br);
    local_4a = anon_unknown_0::MapStatus((Status)iVar3);
  }
  if (local_4a != kSuccess) {
    pSVar6 = (Status *)__cxa_allocate_exception(1);
    *pSVar6 = local_4a;
    __cxa_throw(pSVar6,&Status::typeinfo,0);
  }
  std::
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ::~vector((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
             *)local_438);
  BorderRouter::~BorderRouter
            ((BorderRouter *)
             &routers.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  BorderRouter::~BorderRouter((BorderRouter *)local_290);
  this_local._7_1_ = local_4a;
  nwk._92_4_ = 1;
  Network::~Network((Network *)local_e0);
LAB_0022ae78:
  Domain::~Domain((Domain *)local_48);
  return this_local._7_1_;
}

Assistant:

Registry::Status Registry::Add(BorderAgent const &aValue)
{
    Domain           dom{};
    bool             domainCreated = false;
    Registry::Status status;

    if ((aValue.mPresentFlags & BorderAgent::kDomainNameBit) != 0)
    {
        dom.mName = aValue.mDomainName;
        std::vector<Domain> domains;
        status = MapStatus(mStorage->Lookup(dom, domains));
        if (status == Registry::Status::kError || domains.size() > 1)
        {
            return Registry::Status::kError;
        }

        if (status == Registry::Status::kNotFound)
        {
            DomainId domainId{EMPTY_ID};
            status = MapStatus(mStorage->Add(dom, domainId));
            if (status != Registry::Status::kSuccess)
            {
                return status;
            }
            dom.mId       = domainId;
            domainCreated = true;
        }
        else
        {
            dom = domains[0];
        }
    }

    Network nwk{};
    bool    networkCreated = false;

    try
    {
        if ((aValue.mPresentFlags & BorderAgent::kNetworkNameBit) != 0 ||
            (aValue.mPresentFlags & BorderAgent::kExtendedPanIdBit) != 0)
        {
            // If xpan present lookup with it only
            // Discussed: is different aName an error?
            // Decided: update network aName in the network entity
            if ((aValue.mPresentFlags & BorderAgent::kExtendedPanIdBit) != 0)
            {
                nwk.mXpan = aValue.mExtendedPanId;
            }
            else
            {
                nwk.mName = aValue.mNetworkName;
            }

            std::vector<Network> nwks;
            status = MapStatus(mStorage->Lookup(nwk, nwks));
            if (status == Registry::Status::kError || nwks.size() > 1)
            {
                throw status;
            }

            if (status == Registry::Status::kNotFound)
            {
                NetworkId networkId{EMPTY_ID};
                // It is possible we found the network by xpan
                if ((aValue.mPresentFlags & BorderAgent::kExtendedPanIdBit) != 0 &&
                    (aValue.mPresentFlags & BorderAgent::kNetworkNameBit) != 0)
                {
                    nwk.mName = aValue.mNetworkName;
                }
                nwk.mDomainId = dom.mId;
                nwk.mXpan     = aValue.mExtendedPanId;

                // Provisionally set network's CCM flag considering
                // advertised Connection Mode.
                //
                // Please note that actually see if CCM enabled or not
                // is possible only by respective security policy flag
                // from Active Operational Dataset. Later, if and when
                // successfully petitioned to the network, the flag
                // will be updated by real network dataset.
                nwk.mCcm = ((aValue.mState.mConnectionMode == 4) ? 1 : 0);
                status   = MapStatus(mStorage->Add(nwk, networkId));
                if (status != Registry::Status::kSuccess)
                {
                    throw status;
                }
                nwk.mId        = networkId;
                networkCreated = true;
            }
            else
            {
                nwk = nwks[0];
                if (nwk.mDomainId.mId != dom.mId.mId || nwk.mName != aValue.mNetworkName)
                {
                    nwk.mDomainId.mId = dom.mId.mId;
                    nwk.mName         = aValue.mNetworkName;
                    status            = MapStatus(mStorage->Update(nwk));
                    if (status != Registry::Status::kSuccess)
                    {
                        throw status;
                    }
                }
            }
        }

        BorderRouter br{BorderRouterId{EMPTY_ID}, nwk.mId, aValue};
        try
        {
            if (br.mNetworkId.mId == EMPTY_ID)
            {
                throw Registry::Status::kError;
            }

            // Lookup BorderRouter by address and port to decide to add() or update()
            // Assuming address and port are set (it should be so).
            BorderRouter lookupBr{};
            lookupBr.mAgent.mAddr          = aValue.mAddr;
            lookupBr.mAgent.mExtendedPanId = aValue.mExtendedPanId;
            lookupBr.mAgent.mPresentFlags  = BorderAgent::kAddrBit | BorderAgent::kExtendedPanIdBit;
            std::vector<BorderRouter> routers;
            status = MapStatus(mStorage->Lookup(lookupBr, routers));
            if (status == Registry::Status::kSuccess && routers.size() == 1)
            {
                br.mId.mId = routers[0].mId.mId;
                status     = MapStatus(mStorage->Update(br));
            }
            else if (status == Registry::Status::kNotFound)
            {
                status = MapStatus(mStorage->Add(br, br.mId));
            }

            if (status != Registry::Status::kSuccess)
            {
                throw status;
            }
        } catch (Registry::Status thrownStatus)
        {
            if (networkCreated)
            {
                MapStatus(mStorage->Del(nwk.mId));
            }
            throw;
        }
    } catch (Registry::Status thrownStatus)
    {
        if (domainCreated)
        {
            MapStatus(mStorage->Del(dom.mId));
        }
        status = thrownStatus;
    }
    return status;
}